

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWorker.hpp
# Opt level: O1

void __thiscall sftm::CWorker::DoWork(CWorker *this)

{
  CSyncPrimitive *pCVar1;
  __int_type_conflict _Var2;
  uint32_t uVar3;
  bool bVar4;
  uint uVar5;
  CTask *pCVar6;
  
  do {
    while( true ) {
      if ((this->m_taskQueue).m_nCount == 0) {
        pCVar6 = (CTask *)0x0;
      }
      else {
        while( true ) {
          LOCK();
          pCVar1 = &(this->m_taskQueue).m_lock;
          _Var2 = (pCVar1->m_bLock)._M_base._M_i;
          (pCVar1->m_bLock)._M_base._M_i = true;
          UNLOCK();
          if ((_Var2 & 1U) == 0) break;
          do {
          } while (((this->m_taskQueue).m_lock.m_bLock._M_base._M_i & 1U) != 0);
        }
        uVar3 = (this->m_taskQueue).m_nCount;
        if (uVar3 == 0) {
          pCVar6 = (CTask *)0x0;
        }
        else {
          uVar5 = uVar3 - 1;
          pCVar6 = (this->m_taskQueue).m_pItems[uVar5];
          (this->m_taskQueue).m_nCount = uVar5;
        }
        (this->m_taskQueue).m_lock.m_bLock._M_base._M_i = false;
      }
      if (pCVar6 == (CTask *)0x0) break;
      (*pCVar6->_vptr_CTask[2])(pCVar6,this);
      LOCK();
      (pCVar6->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i =
           (pCVar6->m_chainController->m_nCount).super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
    }
    bVar4 = FindWork(this);
  } while (bVar4);
  return;
}

Assistant:

void DoWork() noexcept
		{
			do
			{
				while (CTask* pTask = PopTask())
				{
					ExecuteTask(pTask);
				}
			} while (FindWork());
		}